

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O1

int luaK_code(FuncState *fs,Instruction i)

{
  int iVar1;
  Proto *pPVar2;
  SharedProto *pSVar3;
  Instruction *pIVar4;
  int *piVar5;
  
  pPVar2 = fs->f;
  patchlistaux(fs,fs->jpc,fs->pc,0xff,fs->pc);
  fs->jpc = -1;
  pSVar3 = pPVar2->sp;
  if (pSVar3->sizecode <= fs->pc) {
    pIVar4 = (Instruction *)
             luaM_growaux_(fs->ls->L,pSVar3->code,&pSVar3->sizecode,4,0x7fffffff,"opcodes");
    pPVar2->sp->code = pIVar4;
  }
  pSVar3 = pPVar2->sp;
  pSVar3->code[fs->pc] = i;
  if (pSVar3->sizelineinfo <= fs->pc) {
    piVar5 = (int *)luaM_growaux_(fs->ls->L,pSVar3->lineinfo,&pSVar3->sizelineinfo,4,0x7fffffff,
                                  "opcodes");
    pPVar2->sp->lineinfo = piVar5;
  }
  pPVar2->sp->lineinfo[fs->pc] = fs->ls->lastline;
  iVar1 = fs->pc;
  fs->pc = iVar1 + 1;
  return iVar1;
}

Assistant:

static int luaK_code (FuncState *fs, Instruction i) {
  Proto *f = fs->f;
  dischargejpc(fs);  /* 'pc' will change */
  /* put new instruction in code array */
  luaM_growvector(fs->ls->L, f->sp->code, fs->pc, f->sp->sizecode, Instruction,
                  MAX_INT, "opcodes");
  f->sp->code[fs->pc] = i;
  /* save corresponding line information */
  luaM_growvector(fs->ls->L, f->sp->lineinfo, fs->pc, f->sp->sizelineinfo, int,
                  MAX_INT, "opcodes");
  f->sp->lineinfo[fs->pc] = fs->ls->lastline;
  return fs->pc++;
}